

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk * hard_centre_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  loc to_avoid;
  ulong uVar2;
  wchar_t w;
  _Bool _Var3;
  int16_t iVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uint32_t uVar8;
  vault *v;
  chunk *c;
  loc_conflict lVar9;
  chunk *pcVar10;
  chunk *c_00;
  chunk *c_01;
  chunk *c_02;
  loc_conflict lVar11;
  int *colors;
  int *counts;
  int iVar12;
  wchar_t wVar13;
  uint uVar14;
  size_t len;
  long lVar15;
  wchar_t wVar16;
  char *pcVar17;
  int iVar18;
  int iVar19;
  loc_conflict grid;
  wchar_t local_b8 [4];
  chunk *local_a8;
  int local_9c;
  wchar_t local_98;
  wchar_t local_94;
  wchar_t local_90;
  wchar_t local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  loc_conflict local_70;
  chunk *local_68;
  ulong local_60;
  loc_conflict floor [4];
  
  uVar5 = Rand_div(2);
  pcVar17 = "Greater vault";
  if (uVar5 == 0) {
    pcVar17 = "Greater vault (new)";
  }
  v = random_vault((int)p->depth,pcVar17,pcVar17);
  c = (chunk *)cave_new((uint)v->hgt,(uint)v->wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  fill_rectangle(c,L'\0',L'\0',(uint)v->hgt + L'\xffffffff',(uint)v->wid + L'\xffffffff',
                 FEAT_GRANITE,L'\0');
  dun->cent_n = L'\0';
  reset_entrance_data(c);
  event_signal_string(EVENT_GEN_ROOM_START,pcVar17);
  lVar9 = loc((uint)(v->wid >> 1),(uint)(v->hgt >> 1));
  _Var3 = build_vault(c,lVar9,v);
  event_signal_flag(EVENT_GEN_ROOM_END,_Var3);
  if (!_Var3) {
    uncreate_artifacts((chunk_conflict *)c);
    cave_free((chunk_conflict *)c);
    c = (chunk *)0x0;
  }
  if (dun->persist == true) {
    uncreate_artifacts((chunk_conflict *)c);
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "no hard centre levels in persistent dungeons";
  }
  else {
    if (*dun->ent_n < 1) {
      wVar13 = L'\x01';
    }
    else {
      uVar5 = Rand_div(3);
      wVar13 = uVar5 + L'\x02';
    }
    dun->wall_n = L'\0';
    wVar7 = L'\0';
    if (wVar13 < L'\x01') {
      wVar13 = L'\0';
    }
    for (; wVar13 != wVar7; wVar7 = wVar7 + L'\x01') {
      if (*dun->ent_n == 0) {
        _Var3 = cave_find((chunk_conflict *)c,&grid,square_iswall_outer);
        if (!_Var3) {
          if (wVar7 == L'\0') {
            uncreate_artifacts((chunk_conflict *)c);
            wipe_mon_list(c,p);
            cave_free((chunk_conflict *)c);
            pcVar17 = "no SQUARE_WALL_OUTER grid for an entrance to the centre vault";
            goto LAB_0014a40b;
          }
          break;
        }
      }
      else {
        grid = choose_random_entrance
                         (c,L'\0',(loc_conflict *)0x0,L'\0',(loc_conflict *)dun->wall,wVar7);
        lVar9 = loc(0,0);
        _Var3 = loc_eq(grid,lVar9);
        if (_Var3) {
          if (wVar7 == L'\0') {
            uncreate_artifacts((chunk_conflict *)c);
            wipe_mon_list(c,p);
            cave_free((chunk_conflict *)c);
            pcVar17 = "random selection of entrance to the centre vault failed";
            goto LAB_0014a40b;
          }
          break;
        }
      }
      pierce_outer_wall(c,grid);
      square_set_feat((chunk_conflict *)c,(loc)grid,FEAT_FLOOR);
    }
    wVar13 = c->height;
    wVar7 = c->width;
    local_94 = wVar7;
    if (wVar13 < wVar7) {
      local_94 = wVar13;
    }
    w = wVar7;
    if (wVar7 < wVar13) {
      w = wVar13;
    }
    uVar2 = (long)((uint)z_info->dungeon_hgt - local_94) / 2;
    local_78 = uVar2 & 0xffffffff;
    wVar6 = (wchar_t)uVar2;
    local_94 = local_94 + wVar6;
    wVar16 = (uint)z_info->dungeon_hgt - local_94;
    pcVar10 = cavern_chunk(p,wVar6,w,(connector *)0x0);
    local_8c = wVar16;
    c_00 = cavern_chunk(p,wVar16,w,(connector *)0x0);
    uVar2 = (long)((uint)z_info->dungeon_wid - w) / 2;
    local_80 = uVar2 & 0xffffffff;
    wVar6 = (wchar_t)uVar2;
    uVar14 = wVar6 + w;
    wVar16 = z_info->dungeon_wid - uVar14;
    local_60 = (ulong)(uint)w;
    c_01 = cavern_chunk(p,(uint)z_info->dungeon_hgt,wVar6,(connector *)0x0);
    local_90 = wVar16;
    c_02 = cavern_chunk(p,(uint)z_info->dungeon_hgt,wVar16,(connector *)0x0);
    local_a8 = pcVar10;
    if ((((pcVar10 == (chunk *)0x0) || (c_00 == (chunk *)0x0)) || (c_01 == (chunk *)0x0)) ||
       (c_02 == (chunk *)0x0)) {
      if (c_02 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c_02);
        cave_free((chunk_conflict *)c_02);
      }
      if (c_01 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c_01);
        cave_free((chunk_conflict *)c_01);
      }
      if (c_00 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)c_00);
        cave_free((chunk_conflict *)c_00);
      }
      pcVar10 = local_a8;
      if (local_a8 != (chunk *)0x0) {
        uncreate_artifacts((chunk_conflict *)local_a8);
        cave_free((chunk_conflict *)pcVar10);
      }
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      *p_error = "could not create one or more of the surrounding caverns";
    }
    else {
      local_98 = (wchar_t)(wVar7 < wVar13);
      pcVar10 = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
      pcVar10->depth = (int)p->depth;
      pcVar10->place = (int)p->place;
      local_68 = c_01;
      chunk_copy((chunk_conflict *)pcVar10,p,(chunk_conflict *)c_01,L'\0',L'\0',L'\0',false);
      lVar9 = loc(0,0);
      wVar13 = (wchar_t)local_80;
      local_88 = (ulong)uVar14;
      lVar11 = loc(wVar13 + L'\xffffffff',z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)pcVar10,&grid,lVar9,lVar11);
      floor[0] = grid;
      chunk_copy((chunk_conflict *)pcVar10,p,(chunk_conflict *)local_a8,L'\0',wVar13,L'\0',false);
      local_70 = loc(wVar13,0);
      local_9c = (int)local_88 + -1;
      wVar7 = (wchar_t)local_78;
      lVar9 = loc(local_9c,wVar7 + L'\xffffffff');
      find_empty_range((chunk_conflict *)pcVar10,&grid,local_70,lVar9);
      floor[1] = grid;
      chunk_copy((chunk_conflict *)pcVar10,p,(chunk_conflict *)c,wVar7,wVar13,local_98,false);
      wVar7 = local_94;
      chunk_copy((chunk_conflict *)pcVar10,p,(chunk_conflict *)c_00,local_94,wVar13,L'\0',false);
      lVar9 = loc(wVar13,wVar7);
      lVar11 = loc(local_9c,z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)pcVar10,&grid,lVar9,lVar11);
      floor[3] = grid;
      wVar13 = (wchar_t)local_88;
      chunk_copy((chunk_conflict *)pcVar10,p,(chunk_conflict *)c_02,L'\0',wVar13,L'\0',false);
      lVar9 = loc(wVar13,0);
      lVar11 = loc(z_info->dungeon_wid - 1,z_info->dungeon_hgt - 1);
      find_empty_range((chunk_conflict *)pcVar10,&grid,lVar9,lVar11);
      floor[2] = grid;
      draw_rectangle(pcVar10,L'\0',L'\0',pcVar10->height + L'\xffffffff',
                     pcVar10->width + L'\xffffffff',FEAT_PERM,L'\0',true);
      len = (long)pcVar10->width * (long)pcVar10->height * 4;
      colors = (int *)mem_zalloc(len);
      counts = (int *)mem_zalloc(len);
      build_colors(pcVar10,colors,counts,(_Bool *)0x0,true);
      for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
        wVar13 = grid_to_i(floor[lVar15],pcVar10->width);
        local_b8[lVar15] = colors[wVar13];
      }
      join_region(pcVar10,colors,counts,local_b8[0],local_b8[1],false);
      join_region(pcVar10,colors,counts,local_b8[2],local_b8[3],false);
      for (lVar15 = 1; lVar15 != 3; lVar15 = lVar15 + 1) {
        wVar13 = grid_to_i(floor[lVar15],pcVar10->width);
        local_b8[lVar15] = colors[wVar13];
      }
      join_region(pcVar10,colors,counts,local_b8[1],local_b8[2],false);
      mem_free(colors);
      mem_free(counts);
      ensure_connectedness(pcVar10,false);
      cave_free((chunk_conflict *)local_68);
      cave_free((chunk_conflict *)local_a8);
      cave_free((chunk_conflict *)c);
      cave_free((chunk_conflict *)c_00);
      cave_free((chunk_conflict *)c_02);
      wVar13 = FEAT_MORE;
      iVar12 = local_90 + (int)local_80;
      uVar1 = z_info->dungeon_hgt;
      iVar18 = (local_8c + (int)local_78) * (int)local_60;
      wVar7 = rand_range(1,3);
      alloc_stairs((chunk_conflict *)pcVar10,wVar13,wVar7,L'\0',false,(connector *)0x0);
      wVar13 = FEAT_LESS;
      wVar7 = rand_range(1,2);
      alloc_stairs((chunk_conflict *)pcVar10,wVar13,wVar7,L'\0',false,(connector *)0x0);
      wVar13 = pcVar10->depth;
      iVar19 = wVar13 / 3;
      if ((uint)(wVar13 + L'\xffffffdf') < 0xffffffe5) {
        iVar19 = (uint)(L'\x05' < wVar13) * 8 + 2;
      }
      uVar2 = (long)(int)(iVar19 * (iVar18 + (uint)uVar1 * iVar12)) /
              (long)(int)((uint)z_info->dungeon_wid * (uint)z_info->dungeon_hgt);
      uVar5 = (uint32_t)uVar2;
      uVar8 = Rand_div(uVar5);
      alloc_objects((chunk_conflict *)pcVar10,L'\x03',L'\0',uVar8 + L'\x01',pcVar10->depth,'\0');
      uVar8 = Rand_div(uVar5);
      alloc_objects((chunk_conflict *)pcVar10,L'\x01',L'\x01',uVar8 + L'\x01',pcVar10->depth,'\0');
      _Var3 = new_player_spot((chunk_conflict *)pcVar10,p);
      if (_Var3) {
        uVar8 = Rand_div(8);
        for (iVar19 = uVar5 + uVar8 + 1; 0 < iVar19; iVar19 = iVar19 + -1) {
          to_avoid.x = (p->grid).x;
          to_avoid.y = (p->grid).y;
          pick_and_place_distant_monster(pcVar10,to_avoid,L'\0',true,pcVar10->depth);
        }
        iVar4 = Rand_normal(uVar5,2);
        alloc_objects((chunk_conflict *)pcVar10,L'\x03',L'\x03',(int)iVar4,pcVar10->depth + L'\x05',
                      '\a');
        iVar4 = Rand_normal((int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                        uVar2 & 0xffffffff) / 2),2);
        alloc_objects((chunk_conflict *)pcVar10,L'\x03',L'\x02',(int)iVar4,pcVar10->depth,'\a');
        wVar13 = Rand_div((uint32_t)
                          ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                          4));
        alloc_objects((chunk_conflict *)pcVar10,L'\x03',L'\x04',wVar13,pcVar10->depth,'\a');
        return pcVar10;
      }
      uncreate_artifacts((chunk_conflict *)pcVar10);
      wipe_mon_list(pcVar10,p);
      cave_free((chunk_conflict *)pcVar10);
      pcVar17 = "could not place player";
LAB_0014a40b:
      *p_error = pcVar17;
    }
  }
  return (chunk *)0x0;
}

Assistant:

struct chunk *hard_centre_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	/* Make a vault for the centre */
	struct chunk *centre = vault_chunk(p);
	int rotate = 0;

	/* Dimensions for the surrounding caverns */
	int centre_cavern_ypos;
	int centre_cavern_hgt, centre_cavern_wid;
	int upper_cavern_hgt, lower_cavern_hgt;
	struct chunk *upper_cavern;
	struct chunk *lower_cavern;
	int lower_cavern_ypos;
	int left_cavern_wid, right_cavern_wid;
	struct chunk *left_cavern;
	struct chunk *right_cavern;
	struct chunk *c;
	int i, k, cavern_area;
	struct loc grid;
	struct loc floor[4];

	/* No persistent levels of this type for now */
	if (dun->persist) {
		uncreate_artifacts(centre);
		wipe_mon_list(centre, p);
		cave_free(centre);
		*p_error = "no hard centre levels in persistent dungeons";
		return NULL;
	}

	/*
	 * Carve out entrances to the vault.  Only use one if there aren't
	 * explicitly marked entrances since those vaults typically have empty
	 * space about them and the extra entrances aren't useful.
	 */
	k = 1 + ((dun->ent_n[0] > 0) ? randint1(3) : 0);
	dun->wall_n = 0;
	for (i = 0; i < k; ++i) {
		if (dun->ent_n[0] == 0) {
			/*
			 * There's no explicitly marked entrances.  Look for a
			 * square marked SQUARE_WALL_OUTER.
			 */
			if (!cave_find(centre, &grid, square_iswall_outer)) {
				if (i == 0) {
					uncreate_artifacts(centre);
					wipe_mon_list(centre, p);
					cave_free(centre);
					*p_error = "no SQUARE_WALL_OUTER grid for an entrance to the centre vault";
					return NULL;
				}
				break;
			}
		} else {
			grid = choose_random_entrance(centre, 0, NULL, 0,
				dun->wall, i);
			if (loc_eq(grid, loc(0, 0))) {
				if (i == 0) {
					uncreate_artifacts(centre);
					wipe_mon_list(centre, p);
					cave_free(centre);
					*p_error = "random selection of entrance to the centre vault failed";
					return NULL;
				}
				break;
			}
		}
		/*
		 * Store position in dun->wall and mark neighbors as invalid
		 * entrances.
		 */
		pierce_outer_wall(centre, grid);
		/* Convert it to a floor. */
		square_set_feat(centre, grid, FEAT_FLOOR);
	}

	/* Measure the vault, rotate to make it wider than it is high */
	if (centre->height > centre->width) {
		rotate = 1;
		centre_cavern_ypos = (z_info->dungeon_hgt - centre->width) / 2;
		centre_cavern_hgt = centre->width;
		centre_cavern_wid = centre->height;
	} else {
		centre_cavern_ypos = (z_info->dungeon_hgt - centre->height) / 2;
		centre_cavern_hgt = centre->height;
		centre_cavern_wid = centre->width;
	}
	upper_cavern_hgt = centre_cavern_ypos;
	lower_cavern_hgt = z_info->dungeon_hgt - upper_cavern_hgt -
		centre_cavern_hgt;
	lower_cavern_ypos = centre_cavern_ypos + centre_cavern_hgt;

	/* Make the caverns */
	upper_cavern = cavern_chunk(p, upper_cavern_hgt, centre_cavern_wid, NULL);
	lower_cavern = cavern_chunk(p, lower_cavern_hgt, centre_cavern_wid, NULL);
	left_cavern_wid = (z_info->dungeon_wid - centre_cavern_wid) / 2;
	right_cavern_wid = z_info->dungeon_wid - left_cavern_wid -
		centre_cavern_wid;
	left_cavern = cavern_chunk(p, z_info->dungeon_hgt, left_cavern_wid, NULL);
	right_cavern = cavern_chunk(p, z_info->dungeon_hgt, right_cavern_wid, NULL);

	/* Return on failure */
	if (!upper_cavern || !lower_cavern || !left_cavern || !right_cavern) {
		if (right_cavern) {
			uncreate_artifacts(right_cavern);
			cave_free(right_cavern);
		}
		if (left_cavern) {
			uncreate_artifacts(left_cavern);
			cave_free(left_cavern);
		}
		if (lower_cavern) {
			uncreate_artifacts(lower_cavern);
			cave_free(lower_cavern);
		}
		if (upper_cavern) {
			uncreate_artifacts(upper_cavern);
			cave_free(upper_cavern);
		}
		uncreate_artifacts(centre);
		wipe_mon_list(centre, p);
		cave_free(centre);
		*p_error = "could not create one or more of the surrounding caverns";
		return NULL;
	}

	/* Make a cave to copy them into, and find a floor square in each cavern */
	c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;

	/* Left */
	chunk_copy(c, p, left_cavern, 0, 0, 0, false);
	find_empty_range(c, &grid, loc(0, 0),
					 loc(left_cavern_wid - 1, z_info->dungeon_hgt - 1));
	floor[0] = grid;

	/* Upper */
	chunk_copy(c, p, upper_cavern, 0, left_cavern_wid, 0, false);
	find_empty_range(c, &grid, loc(left_cavern_wid, 0),
					 loc(left_cavern_wid + centre_cavern_wid - 1,
						 upper_cavern_hgt - 1));
	floor[1] = grid;

	/* Centre */
	chunk_copy(c, p, centre, centre_cavern_ypos, left_cavern_wid, rotate, false);

	/* Lower */
	chunk_copy(c, p, lower_cavern, lower_cavern_ypos, left_cavern_wid, 0, false);
	find_empty_range(c, &grid, loc(left_cavern_wid, lower_cavern_ypos),
					 loc(left_cavern_wid + centre_cavern_wid - 1,
						 z_info->dungeon_hgt - 1));
	floor[3] = grid;

	/* Right */
	chunk_copy(c, p, right_cavern, 0, left_cavern_wid + centre_cavern_wid, 0,
		false);
	find_empty_range(c, &grid, loc(left_cavern_wid + centre_cavern_wid, 0),
		loc(z_info->dungeon_wid - 1, z_info->dungeon_hgt - 1));
	floor[2] = grid;

	/* Encase in perma-rock */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect up all the caverns */
	connect_caverns(c, floor);

	/* Connect to the centre entrances. */
	ensure_connectedness(c, false);

	/* Free all the chunks */
	cave_free(left_cavern);
	cave_free(upper_cavern);
	cave_free(centre);
	cave_free(lower_cavern);
	cave_free(right_cavern);

	cavern_area = (left_cavern_wid + right_cavern_wid) * z_info->dungeon_hgt +
		centre_cavern_wid * (upper_cavern_hgt + lower_cavern_hgt);

	/* Place 2-3 down stairs near some walls */
	alloc_stairs(c, FEAT_MORE, rand_range(1, 3), 0, false, NULL);

	/* Place 1-2 up stairs near some walls */
	alloc_stairs(c, FEAT_LESS, rand_range(1, 2), 0, false, NULL);

	/* Generate some rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Scale number by total cavern size - caverns are fairly sparse */
	k = (k * cavern_area) / (z_info->dungeon_hgt * z_info->dungeon_wid);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_BOTH, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k), c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Put some monsters in the dungeon */
	for (i = randint1(8) + k; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT, Rand_normal(k, 2), c->depth + 5,
		ORIGIN_CAVERN);
	alloc_objects(c, SET_BOTH, TYP_GOLD, Rand_normal(k / 2, 2), c->depth,
		ORIGIN_CAVERN);
	alloc_objects(c, SET_BOTH, TYP_GOOD, randint0(k / 4), c->depth,
		ORIGIN_CAVERN);

	return c;
}